

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_pretailcall(lua_State *L,CallInfo *ci,StkId func,int narg1,int delta)

{
  long lVar1;
  StkId pSVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ptrdiff_t t___1;
  TValue *io2;
  TValue *io1;
  ptrdiff_t t__;
  int i;
  int nfixparams;
  int fsize;
  Proto *p;
  uint status;
  int delta_local;
  int narg1_local;
  StkId func_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  p._4_4_ = 0;
  status = narg1;
  _delta_local = func;
  while( true ) {
    bVar4 = (_delta_local->val).tt_ & 0x3f;
    if (bVar4 == 6) {
      lVar3 = *(long *)((_delta_local->val).value_.f + 0x18);
      uVar6 = (uint)*(byte *)(lVar3 + 0xc);
      bVar4 = *(byte *)(lVar3 + 10);
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(int)(uVar6 - delta)) {
        lVar1 = (L->stack).offset;
        luaD_growstack(L,uVar6 - delta,1);
        _delta_local = (StkId)((long)(L->stack).p + ((long)_delta_local - lVar1));
      }
      (ci->func).p = (ci->func).p + -(long)delta;
      for (t__._4_4_ = 0; t__._4_4_ < (int)status; t__._4_4_ = t__._4_4_ + 1) {
        pSVar2 = (ci->func).p;
        pSVar2[t__._4_4_].val.value_ = _delta_local[t__._4_4_].val.value_;
        *(lu_byte *)((long)(pSVar2 + t__._4_4_) + 8) = _delta_local[t__._4_4_].val.tt_;
      }
      pSVar2 = (ci->func).p;
      for (; (int)status <= (int)(uint)bVar4; status = status + 1) {
        (&pSVar2->val)[(int)status].tt_ = '\0';
      }
      (ci->top).p = pSVar2 + (long)(int)uVar6 + 1;
      (ci->u).l.savedpc = *(Instruction **)(lVar3 + 0x40);
      ci->callstatus = ci->callstatus | 0x400000;
      (L->top).p = pSVar2 + (int)status;
      return -1;
    }
    if (bVar4 == 0x16) break;
    if (bVar4 == 0x26) {
      iVar5 = precallC(L,_delta_local,p._4_4_,
                       *(lua_CFunction *)((_delta_local->val).value_.f + 0x18));
      return iVar5;
    }
    if ((long)(L->stack_last).p - (L->top).offset >> 4 < 2) {
      lVar3 = (L->stack).offset;
      luaD_growstack(L,1,1);
      _delta_local = (StkId)((long)(L->stack).p + ((long)_delta_local - lVar3));
    }
    p._4_4_ = tryfuncTM(L,_delta_local,p._4_4_);
    status = status + 1;
  }
  iVar5 = precallC(L,_delta_local,p._4_4_,(_delta_local->val).value_.f);
  return iVar5;
}

Assistant:

int luaD_pretailcall (lua_State *L, CallInfo *ci, StkId func,
                                    int narg1, int delta) {
  unsigned status = LUA_MULTRET + 1;
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      return precallC(L, func, status, clCvalue(s2v(func))->f);
    case LUA_VLCF:  /* light C function */
      return precallC(L, func, status, fvalue(s2v(func)));
    case LUA_VLCL: {  /* Lua function */
      Proto *p = clLvalue(s2v(func))->p;
      int fsize = p->maxstacksize;  /* frame size */
      int nfixparams = p->numparams;
      int i;
      checkstackp(L, fsize - delta, func);
      ci->func.p -= delta;  /* restore 'func' (if vararg) */
      for (i = 0; i < narg1; i++)  /* move down function and arguments */
        setobjs2s(L, ci->func.p + i, func + i);
      func = ci->func.p;  /* moved-down function */
      for (; narg1 <= nfixparams; narg1++)
        setnilvalue(s2v(func + narg1));  /* complete missing arguments */
      ci->top.p = func + 1 + fsize;  /* top for new function */
      lua_assert(ci->top.p <= L->stack_last.p);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus |= CIST_TAIL;
      L->top.p = func + narg1;  /* set top */
      return -1;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* space for metamethod */
      status = tryfuncTM(L, func, status);  /* try '__call' metamethod */
      narg1++;
      goto retry;  /* try again */
    }
  }
}